

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool __thiscall
DynamicProfileStorageReaderWriter::ReadUtf8String
          (DynamicProfileStorageReaderWriter *this,char16 **str,DWORD *len)

{
  bool bVar1;
  charcount_t cVar2;
  LPCUTF8 t;
  char16 *buffer;
  uint local_34 [2];
  DWORD urllen;
  
  bVar1 = ReadArray<unsigned_int>(this,local_34,1);
  if (bVar1) {
    t = (LPCUTF8)Memory::NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,
                            (ulong)local_34[0]);
    if (t == (LPCUTF8)0x0) {
      Output::Print(L"ERROR: DynamicProfileStorage: Out of memory reading \'%s\'\n",this->filename);
      Output::Flush();
      return false;
    }
    bVar1 = ReadArray<unsigned_char>(this,t,(ulong)local_34[0]);
    if (bVar1) {
      cVar2 = utf8::ByteIndexIntoCharacterIndex(t,(ulong)local_34[0],doDefault);
      buffer = (char16 *)
               Memory::NoCheckHeapAllocator::Alloc
                         ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,
                          (ulong)(cVar2 + 1) * 2);
      if (buffer != (char16 *)0x0) {
        utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                  (buffer,t,t + local_34[0],doDefault,(bool *)0x0);
        Memory::NoCheckHeapAllocator::Free
                  ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,t,
                   (ulong)local_34[0]);
        *str = buffer;
        *len = cVar2;
        return true;
      }
      Output::Print(L"ERROR: DynamicProfileStorage: Out of memory reading \'%s\'\n",this->filename);
      Output::Flush();
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,t,(ulong)local_34[0]);
      return false;
    }
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,t,(ulong)local_34[0]);
  }
  return false;
}

Assistant:

bool DynamicProfileStorageReaderWriter::ReadUtf8String(__deref_out_z char16 ** str, __out DWORD * len)
{
    DWORD urllen;
    if (!Read(&urllen))
    {
        return false;
    }

    utf8char_t* tempBuffer = NoCheckHeapNewArray(utf8char_t, urllen);
    if (tempBuffer == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory reading '%s'\n"), filename);
        Output::Flush();
        return false;
    }

    if (!ReadArray(tempBuffer, urllen))
    {
        HeapDeleteArray(urllen, tempBuffer);
        return false;
    }

    charcount_t length = utf8::ByteIndexIntoCharacterIndex(tempBuffer, urllen);
    char16 * name = NoCheckHeapNewArray(char16, length + 1);
    if (name == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory reading '%s'\n"), filename);
        Output::Flush();
        HeapDeleteArray(urllen, tempBuffer);
        return false;
    }
    utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(name, tempBuffer, tempBuffer + urllen);
    NoCheckHeapDeleteArray(urllen, tempBuffer);
    *str = name;
    *len = length;
    return true;
}